

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir.cc
# Opt level: O3

void __thiscall IR::IRBuilder::move(IRBuilder *this,Temp *target,Temp *source)

{
  BasicBlock *pBVar1;
  pointer ppSVar2;
  Function *pFVar3;
  int iVar4;
  _Fwd_list_node_base *p_Var5;
  _Fwd_list_node_base *local_28;
  
  pBVar1 = this->block_;
  ppSVar2 = (pBVar1->super_vector<IR::Stmt_*,_std::allocator<IR::Stmt_*>_>).
            super__Vector_base<IR::Stmt_*,_std::allocator<IR::Stmt_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  if ((((pBVar1->super_vector<IR::Stmt_*,_std::allocator<IR::Stmt_*>_>).
        super__Vector_base<IR::Stmt_*,_std::allocator<IR::Stmt_*>_>._M_impl.super__Vector_impl_data.
        _M_start != ppSVar2) && (iVar4 = (*ppSVar2[-1]->_vptr_Stmt[3])(), (char)iVar4 != '\0')) &&
     ((pBVar1->super_vector<IR::Stmt_*,_std::allocator<IR::Stmt_*>_>).
      super__Vector_base<IR::Stmt_*,_std::allocator<IR::Stmt_*>_>._M_impl.super__Vector_impl_data.
      _M_finish[-1] != (Stmt *)0x0)) {
    return;
  }
  pFVar3 = this->function_;
  p_Var5 = (_Fwd_list_node_base *)operator_new(0x20);
  p_Var5[2]._M_next = (_Fwd_list_node_base *)source;
  p_Var5[3]._M_next = (_Fwd_list_node_base *)target;
  p_Var5[1]._M_next = (_Fwd_list_node_base *)&PTR__Stmt_00136430;
  p_Var5->_M_next =
       (pFVar3->moves_).super__Fwd_list_base<IR::Move,_std::allocator<IR::Move>_>._M_impl._M_head.
       _M_next;
  (pFVar3->moves_).super__Fwd_list_base<IR::Move,_std::allocator<IR::Move>_>._M_impl._M_head._M_next
       = p_Var5;
  local_28 = (this->function_->moves_).super__Fwd_list_base<IR::Move,_std::allocator<IR::Move>_>.
             _M_impl._M_head._M_next + 1;
  std::vector<IR::Stmt*,std::allocator<IR::Stmt*>>::emplace_back<IR::Stmt*>
            ((vector<IR::Stmt*,std::allocator<IR::Stmt*>> *)this->block_,(Stmt **)&local_28);
  return;
}

Assistant:

void IRBuilder::move(const Temp* target, const Temp* source) {
  if (block_->isTerminated()) return;
  function_->moves_.emplace_front(target, source);
  block_->push_back(&function_->moves_.front());
}